

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O1

double __thiscall
opengv::absolute_pose::modules::Epnp::reprojection_error(Epnp *this,double (*R) [3],double *t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double *pdVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  
  iVar10 = this->number_of_correspondences;
  if (iVar10 < 1) {
    dVar25 = 0.0;
  }
  else {
    lVar12 = 0x10;
    lVar13 = 8;
    lVar11 = 0;
    dVar25 = 0.0;
    do {
      pdVar9 = this->pws;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)((long)pdVar9 + lVar12 + -0x10);
      dVar14 = *(double *)((long)pdVar9 + lVar12 + -8);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (*R)[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar14 * (*R)[1];
      auVar1 = vfmadd231sd_fma(auVar21,auVar15,auVar1);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)((long)pdVar9 + lVar12);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (*R)[2];
      auVar1 = vfmadd231sd_fma(auVar1,auVar23,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = R[1][0];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar14 * R[1][1];
      auVar2 = vfmadd231sd_fma(auVar24,auVar15,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = R[1][2];
      auVar2 = vfmadd231sd_fma(auVar2,auVar23,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = R[2][0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar14 * R[2][1];
      auVar3 = vfmadd231sd_fma(auVar18,auVar15,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = R[2][2];
      auVar3 = vfmadd231sd_fma(auVar3,auVar23,auVar6);
      auVar16._0_8_ = 1.0 / (auVar3._0_8_ + t[2]);
      auVar16._8_8_ = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = this->uc;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = (auVar1._0_8_ + *t) * this->fu;
      auVar1 = vfmadd213sd_fma(auVar19,auVar16,auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = this->vc;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = (auVar2._0_8_ + t[1]) * this->fv;
      auVar2 = vfmadd213sd_fma(auVar22,auVar16,auVar8);
      dVar14 = *(double *)((long)this->us + lVar13) - auVar2._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar14 * dVar14;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(double *)((long)this->us + lVar13 + -8) - auVar1._0_8_;
      auVar1 = vfmadd231sd_fma(auVar17,auVar20,auVar20);
      if (auVar1._0_8_ < 0.0) {
        dVar14 = sqrt(auVar1._0_8_);
      }
      else {
        auVar1 = vsqrtsd_avx(auVar1,auVar1);
        dVar14 = auVar1._0_8_;
      }
      dVar25 = dVar25 + dVar14;
      lVar11 = lVar11 + 1;
      iVar10 = this->number_of_correspondences;
      lVar12 = lVar12 + 0x18;
      lVar13 = lVar13 + 0x10;
    } while (lVar11 < iVar10);
  }
  return dVar25 / (double)iVar10;
}

Assistant:

double
opengv::absolute_pose::modules::Epnp::reprojection_error(
    const double R[3][3],
    const double t[3])
{
  double sum2 = 0.0;

  for(int i = 0; i < number_of_correspondences; i++)
  {
    double * pw = pws + 3 * i;
    double Xc = dot(R[0], pw) + t[0];
    double Yc = dot(R[1], pw) + t[1];
    double inv_Zc = 1.0 / (dot(R[2], pw) + t[2]);
    double ue = uc + fu * Xc * inv_Zc;
    double ve = vc + fv * Yc * inv_Zc;
    double u = us[2 * i], v = us[2 * i + 1];

    sum2 += sqrt( (u - ue) * (u - ue) + (v - ve) * (v - ve) );
  }

  return sum2 / number_of_correspondences;
}